

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_modifier.hpp
# Opt level: O1

DistinctModifier * __thiscall
duckdb::ResultModifier::Cast<duckdb::DistinctModifier>(ResultModifier *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == DISTINCT_MODIFIER) {
    return (DistinctModifier *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Failed to cast result modifier to type - result modifier type mismatch","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const TARGET &Cast() const {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast result modifier to type - result modifier type mismatch");
		}
		return reinterpret_cast<const TARGET &>(*this);
	}